

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BamStandardIndex::RaiiWrapper::~RaiiWrapper(RaiiWrapper *this)

{
  if (this->Device != (IBamIODevice *)0x0) {
    (*this->Device->_vptr_IBamIODevice[2])();
    if (this->Device != (IBamIODevice *)0x0) {
      (*this->Device->_vptr_IBamIODevice[1])();
    }
    this->Device = (IBamIODevice *)0x0;
  }
  if (this->Buffer != (char *)0x0) {
    operator_delete__(this->Buffer);
    this->Buffer = (char *)0x0;
  }
  return;
}

Assistant:

BamStandardIndex::RaiiWrapper::~RaiiWrapper()
{

    if (Device) {
        Device->Close();
        delete Device;
        Device = 0;
    }

    if (Buffer) {
        delete[] Buffer;
        Buffer = 0;
    }
}